

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

double lerch(double z,int s,double a)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 0.0;
  if (z <= 0.0) {
    return 0.0;
  }
  dVar4 = 1.0;
  iVar1 = 0;
  do {
    dVar2 = (double)iVar1 + a;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar2 = pow(dVar2,(double)s);
      dVar3 = dVar3 + dVar4 / dVar2;
      if (ABS(dVar4 / dVar2) <= (ABS(dVar3) + 1.0) * 1e-10) {
        return dVar3;
      }
    }
    iVar1 = iVar1 + 1;
    dVar4 = dVar4 * z;
  } while( true );
}

Assistant:

BURKHARDT_EXPORT
double lerch ( double z, int s, double a )

//****************************************************************************80
//
//  Purpose:
//
//    LERCH estimates the Lerch transcendent function.
//
//  Definition:
//
//    The Lerch transcendent function is defined as:
//
//      LERCH ( Z, S, A ) = Sum ( 0 <= K < +oo ) Z^K / ( A + K )^S
//
//    excluding any term with ( A + K ) = 0.
//
//    In Mathematica, the function can be evaluated by:
//
//      LerchPhi[z,s,a]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 May 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Thanks:
//
//    Oscar van Vlijmen
//
//  Parameters:
//
//    Input, double Z, int S, double A, the parameters of the function.
//
//    Output, double LERCH, an approximation to the Lerch
//    transcendent function.
//
{
  double eps = 1.0E-10;
  int k;
  double total;
  double term;
  double z_k;

  total = 0.0;

  if ( z <= 0.0 )
  {
    return total;
  }

  k = 0;
  z_k = 1.0;

  for ( ; ; )
  {
    if ( a + double( k ) != 0.0 )
    {
      term = z_k / pow ( a + double(k), s );

      total = total + term;

      if ( fabs ( term ) <= eps * ( 1.0 + fabs ( total ) ) )
      {
        break;
      }
    }

    k = k + 1;
    z_k = z_k * z;

  }

  return total;
}